

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O0

int do_command(int command,int repcount,boolean firsttime,nh_cmd_arg *arg)

{
  _func_int *fn;
  code *pcVar1;
  boolean bVar2;
  uint uVar3;
  uint local_70;
  boolean allow_zeroobj;
  int functype;
  int argtype;
  nh_cmd_arg noarg;
  obj *otmp;
  obj *obj;
  _func_int_obj_ptr *func_obj;
  _func_int_int_int *func_pos;
  _func_int_int_int_int *func_dir;
  _func_int *func;
  int res;
  int y;
  int x;
  schar dz;
  schar dy;
  schar dx;
  nh_cmd_arg *arg_local;
  int iStack_10;
  boolean firsttime_local;
  int repcount_local;
  int command_local;
  
  functype = 2;
  argtype = 0;
  _x = arg;
  arg_local._4_4_ = repcount;
  iStack_10 = command;
  if (command == -1) {
    iStack_10 = prev_command;
    _x = &prev_arg;
    arg_local._4_4_ = prev_repcount;
  }
  if (_x == (nh_cmd_arg *)0x0) {
    _x = (nh_cmd_arg *)&functype;
  }
  prev_command = iStack_10;
  prev_arg = *_x;
  prev_repcount = arg_local._4_4_;
  flags.move = '\0';
  multi = 0;
  if (firsttime != '\0') {
    u.last_str_turn = 0;
    flags.nopick = '\0';
  }
  if (iStack_10 == -1) {
    repcount_local = 1;
  }
  else {
    arg_local._3_1_ = firsttime;
    if (firsttime != '\0') {
      check_tutorial_command(iStack_10,_x);
    }
    local_70 = cmdlist[iStack_10].flags & 0x1c;
    if (local_70 == 0) {
      local_70 = 2;
    }
    uVar3 = _x->argtype & cmdlist[iStack_10].flags;
    if (uVar3 == 0) {
      repcount_local = 2;
    }
    else {
      if ((((byte)u._1052_1_ >> 5 & 1) == 0) || (cmdlist[iStack_10].can_if_buried != '\0')) {
        multi = arg_local._4_4_;
        switch(local_70) {
        case 2:
          fn = (_func_int *)cmdlist[iStack_10].func;
          if (((cmdlist[iStack_10].text != (char *)0x0) && (occupation == (_func_int *)0x0)) &&
             (1 < arg_local._4_4_)) {
            set_occupation(fn,cmdlist[iStack_10].text,arg_local._4_4_ + -1);
          }
          flags.move = '\x01';
          func._0_4_ = (*fn)();
          break;
        case 4:
          pcVar1 = (code *)cmdlist[iStack_10].func;
          if (arg_local._3_1_ == '\0') {
            y._3_1_ = u.dx;
            y._2_1_ = u.dy;
            y._1_1_ = '\0';
          }
          else if (uVar3 == 4) {
            bVar2 = dir_to_delta((_x->field_1).d,(schar *)((long)&y + 3),(schar *)((long)&y + 2),
                                 (schar *)((long)&y + 1));
            if (bVar2 == '\0') {
              return 2;
            }
            if (((y._3_1_ != '\0') && (y._2_1_ != '\0')) && (u.umonnum == 0x78)) {
              return 2;
            }
          }
          else {
            y._3_1_ = -2;
            y._2_1_ = -2;
            y._1_1_ = -2;
          }
          flags.move = '\x01';
          if (arg_local._3_1_ != '\0') {
            u.dx = y._3_1_;
            u.dy = y._2_1_;
          }
          func._0_4_ = (*pcVar1)((int)y._3_1_,(int)y._2_1_,(int)y._1_1_);
          break;
        default:
          multi = 0;
          return 2;
        case 8:
          if (uVar3 == 8) {
            res = (int)(_x->field_1).pos.x;
            func._4_4_ = (int)(_x->field_1).pos.y;
          }
          else {
            res = -1;
            func._4_4_ = -1;
          }
          flags.move = '\x01';
          func._0_4_ = (*(code *)cmdlist[iStack_10].func)(res,func._4_4_);
          break;
        case 0x10:
          otmp = (obj *)0x0;
          if (uVar3 == 0x10) {
            if (((cmdlist[iStack_10].flags & 0x8000) != 0) && ((_x->field_1).invlet == '-')) {
              otmp = &zeroobj;
            }
            for (noarg = (nh_cmd_arg)invent; noarg != (nh_cmd_arg)0x0 && otmp == (obj *)0x0;
                noarg = *(nh_cmd_arg *)noarg) {
              if (*(char *)((long)noarg + 0x36) == (_x->field_1).invlet) {
                otmp = (obj *)noarg;
              }
            }
          }
          flags.move = '\x01';
          func._0_4_ = (*(code *)cmdlist[iStack_10].func)(otmp);
        }
        if (0 < multi) {
          multi = multi + -1;
        }
      }
      else {
        pline("You can\'t do that while you are buried!");
        func._0_4_ = 0;
      }
      if ((int)func == 0) {
        flags.move = '\0';
        multi = 0;
      }
      repcount_local = 3;
    }
  }
  return repcount_local;
}

Assistant:

int do_command(int command, int repcount, boolean firsttime, struct nh_cmd_arg *arg)
{
	schar dx, dy, dz;
	int x, y;
	int res, (*func)(void), (*func_dir)(int, int, int), (*func_pos)(int,int);
	int (*func_obj)(struct obj*);
	struct obj *obj, *otmp;
	struct nh_cmd_arg noarg = {CMD_ARG_NONE};
	int argtype, functype;
	boolean allow_zeroobj;
	
	/* for multi-turn movement, we use re-invocation of do_command rather
	 * than set_occupation, so the relevant command must be saved and restored */
	if (command == -1) {
	    command = prev_command;
	    arg = &prev_arg;
	    repcount = prev_repcount;
	}
	
	/* NULL arg is synonymous to CMD_ARG_NONE */
	if (!arg)
	    arg = &noarg;
	
	prev_command = command;
	prev_arg = *arg;
	prev_repcount = repcount;
	
	flags.move = FALSE;
	multi = 0;
	
	if (firsttime) {
	    u.last_str_turn = 0; /* for flags.run > 1 movement */
	    flags.nopick = 0;
	}
	
	if (command == -1)
	    return COMMAND_UNKNOWN;
	
	/* Collect commands to show suitable ambient tutorial messages. */
	if (firsttime)
	    check_tutorial_command(command, arg);
	
	/* in some cases, a command function will accept either it's proper argument
	 * type or no argument; we're looking for the possible type of the argument here */
	functype = (cmdlist[command].flags & CMD_ARG_FLAGS);
	if (!functype)
	    functype = CMD_ARG_NONE;
	allow_zeroobj = (cmdlist[command].flags & CMD_ZEROOBJ) ? TRUE : FALSE;

	argtype = (arg->argtype & cmdlist[command].flags);
	if (!argtype)
	    return COMMAND_BAD_ARG;
	
	if (u.uburied && !cmdlist[command].can_if_buried) {
	    pline("You can't do that while you are buried!");
	    res = 0;
	} else {
	    multi = repcount;
	    
	    switch (functype) {
		case CMD_ARG_NONE:
		    func = cmdlist[command].func;
		    if (cmdlist[command].text && !occupation && multi > 1)
			set_occupation(func, cmdlist[command].text, multi - 1);
		    flags.move = TRUE;
		    res = (*func)();		/* perform the command */
		    break;
		
		case CMD_ARG_DIR:
		    func_dir = cmdlist[command].func;
		    if (!firsttime) {
			/* for multi-move commands such as dogo ('g') and
			 * dogo2 ('G'), the last-used direction is kept in u.dx
			 * and u.dy. lookaround() may change these values! */
			dx = u.dx;
			dy = u.dy;
			dz = 0;
		    }
		    else if (argtype == CMD_ARG_DIR) {
			if (!dir_to_delta(arg->d, &dx, &dy, &dz))
			    return COMMAND_BAD_ARG;
			if (dx && dy && u.umonnum == PM_GRID_BUG)
			    return COMMAND_BAD_ARG;
			
		    } else {
			 /* invalid direction deltas indicate that no arg was given */
			dx = -2; dy = -2; dz = -2;
		    }
		    flags.move = TRUE;
		    if (firsttime) {
			u.dx = dx;
			u.dy = dy;
		    }
		    res = func_dir(dx, dy, dz);
		    break;
		
		case CMD_ARG_POS:
		    func_pos = cmdlist[command].func;
		    if (argtype == CMD_ARG_POS) {
			x = arg->pos.x;
			y = arg->pos.y;
		    } else {
			x = -1;
			y = -1;
		    }
		    flags.move = TRUE;
		    res = func_pos(x, y);
		    break;
		
		case CMD_ARG_OBJ:
		    func_obj = cmdlist[command].func;
		    obj = NULL;
		    if (argtype == CMD_ARG_OBJ) {
			if (allow_zeroobj && arg->invlet == '-')
			    obj = &zeroobj;
			for (otmp = invent; otmp && !obj; otmp = otmp->nobj)
			    if (otmp->invlet == arg->invlet)
				obj = otmp;
		    }
		    flags.move = TRUE;
		    res = func_obj(obj);
		    break;
		    
		default:
		    multi = 0;
		    return COMMAND_BAD_ARG;
	    }
	    
	    if (multi > 0)
		--multi;
	}
	
	if (!res) {
	    flags.move = FALSE;
	    multi = 0;
	}
	
	return COMMAND_OK;
}